

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O3

void __thiscall
Hospital::Update_Nurses_Time_Table_File
          (Hospital *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *Nurses_Timetable,ofstream *inFile)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  int i;
  long lVar4;
  ofstream abus;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  system("pause");
  std::ofstream::ofstream(&local_230);
  std::ofstream::open((char *)&local_230,0x1291a7);
  lVar4 = 0;
  do {
    lVar3 = 8;
    do {
      lVar1 = *(long *)&(Nurses_Timetable->
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[lVar4].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_230,*(char **)(lVar1 + -8 + lVar3),
                          *(long *)(lVar1 + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
      lVar3 = lVar3 + 0x20;
    } while (lVar3 != 200);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 7);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void Hospital::  Update_Nurses_Time_Table_File (vector<vector<string>>& Nurses_Timetable , ofstream& inFile){
    system("pause");
    //  cout << "hiiiii";
    ofstream abus;
    abus.open("Nurses_Timetable.txt");
    //abus <<"Asghar";

    for (int i = 0; i < 7; i++) {
        for (int j = 0; j < 6; ++j) {
     //       Nurses_Timetable[i][j].erase(std::remove_if(Nurses_Timetable[i][j].begin(), Nurses_Timetable[i][j].end(), ::isspace), Nurses_Timetable[i][j].end());
            abus << Nurses_Timetable[i][j] << " ";
//            abus <<"Asghar";
        }
        abus << "\n";
    }
    //inFile.close();

}